

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BerdyHelper.cpp
# Opt level: O3

bool __thiscall
iDynTree::BerdyHelper::serializeDynamicVariablesFloatingBase
          (BerdyHelper *this,LinkProperAccArray *properAccs,
          LinkNetTotalWrenchesWithoutGravity *param_2,LinkNetExternalWrenches *netExtWrenches,
          LinkInternalWrenches *linkJointWrenches,JointDOFsDoubleArray *param_5,
          JointDOFsDoubleArray *jointAccs,VectorDynSize *d)

{
  double *pdVar1;
  undefined8 uVar2;
  double dVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  Twist *pTVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  long *plVar12;
  undefined8 *puVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  JointIndex idx;
  void *pvVar17;
  long lVar18;
  long lVar19;
  Index size;
  IndexRange IVar20;
  ClassicalAcc sensorProperAcc;
  Matrix<double,_6,_1,_0,_6,_1> ret;
  SpatialAcc local_98;
  undefined8 local_68 [4];
  undefined8 uStack_48;
  undefined8 local_40;
  
  iDynTree::VectorDynSize::resize((ulong)d);
  lVar6 = iDynTree::Model::getNrOfLinks();
  if (0 < lVar6) {
    lVar6 = 0;
    do {
      pTVar7 = (Twist *)iDynTree::LinkAccArray::operator()(properAccs,lVar6);
      iDynTree::LinkVelArray::operator()(&this->m_linkVels,lVar6);
      iDynTree::ClassicalAcc::fromSpatial(&local_98,pTVar7);
      IVar20 = getRangeLinkVariable(this,LINK_BODY_PROPER_CLASSICAL_ACCELERATION,lVar6);
      uVar15 = IVar20.size;
      lVar8 = iDynTree::VectorDynSize::data();
      iDynTree::VectorDynSize::size();
      uVar9 = IVar20.offset * 8 + lVar8;
      uVar14 = uVar15;
      if (((uVar9 & 7) == 0) &&
         (uVar14 = (ulong)((uint)(uVar9 >> 3) & 1), (long)uVar15 <= (long)uVar14)) {
        uVar14 = uVar15;
      }
      if (0 < (long)uVar14) {
        uVar16 = 0;
        do {
          *(double *)(uVar9 + uVar16 * 8) =
               local_98.super_SpatialMotionVector.super_SpatialVector<iDynTree::SpatialMotionVector>
               .linearVec3.super_Vector3.m_data[uVar16];
          uVar16 = uVar16 + 1;
        } while (uVar14 != uVar16);
      }
      lVar8 = uVar15 - uVar14;
      uVar16 = (lVar8 - (lVar8 >> 0x3f) & 0xfffffffffffffffeU) + uVar14;
      if (1 < lVar8) {
        do {
          dVar3 = *(double *)
                   ((long)local_98.super_SpatialMotionVector.
                          super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.
                          super_Vector3.m_data + uVar14 * 8 + 8);
          pdVar1 = (double *)(uVar9 + uVar14 * 8);
          *pdVar1 = local_98.super_SpatialMotionVector.
                    super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.super_Vector3.
                    m_data[uVar14];
          pdVar1[1] = dVar3;
          uVar14 = uVar14 + 2;
        } while ((long)uVar14 < (long)uVar16);
      }
      if ((long)uVar16 < (long)uVar15) {
        do {
          *(double *)(uVar9 + uVar16 * 8) =
               local_98.super_SpatialMotionVector.super_SpatialVector<iDynTree::SpatialMotionVector>
               .linearVec3.super_Vector3.m_data[uVar16];
          uVar16 = uVar16 + 1;
        } while (uVar15 != uVar16);
      }
      IVar20 = getRangeLinkVariable(this,NET_EXT_WRENCH,lVar6);
      uVar9 = IVar20.size;
      lVar8 = IVar20.offset;
      lVar10 = iDynTree::LinkWrenches::operator()(netExtWrenches,lVar6);
      local_68[0] = *(undefined8 *)(lVar10 + 8);
      local_68[1] = *(undefined8 *)(lVar10 + 0x10);
      local_68[2] = *(undefined8 *)(lVar10 + 0x18);
      local_68[3] = *(undefined8 *)(lVar10 + 0x20);
      uStack_48 = *(undefined8 *)(lVar10 + 0x28);
      local_40 = *(undefined8 *)(lVar10 + 0x30);
      lVar10 = iDynTree::VectorDynSize::data();
      iDynTree::VectorDynSize::size();
      pvVar17 = (void *)(lVar8 * 8 + lVar10);
      uVar14 = uVar9;
      if ((((ulong)pvVar17 & 7) == 0) &&
         (uVar14 = (ulong)((uint)((ulong)pvVar17 >> 3) & 1), (long)uVar9 <= (long)uVar14)) {
        uVar14 = uVar9;
      }
      if (0 < (long)uVar14) {
        memcpy(pvVar17,local_68,uVar14 * 8);
      }
      lVar18 = uVar9 - uVar14;
      lVar19 = (lVar18 - (lVar18 >> 0x3f) & 0xfffffffffffffffeU) + uVar14;
      if (1 < lVar18) {
        lVar11 = uVar14 + 2;
        if ((long)(uVar14 + 2) < lVar19) {
          lVar11 = lVar19;
        }
        memcpy((void *)(lVar10 + (lVar8 + uVar14) * 8),local_68 + uVar14,
               (~uVar14 + lVar11 & 0xfffffffffffffffe) * 8 + 0x10);
      }
      if (lVar19 < (long)uVar9) {
        memcpy((void *)(lVar10 + (lVar18 / 2) * 0x10 + lVar8 * 8 + uVar14 * 8),
               local_68 + (lVar18 / 2) * 2 + uVar14,(lVar18 % 2) * 8);
      }
      lVar6 = lVar6 + 1;
      lVar8 = iDynTree::Model::getNrOfLinks();
    } while (lVar6 < lVar8);
  }
  lVar6 = iDynTree::Model::getNrOfJoints();
  if (0 < lVar6) {
    idx = 0;
    do {
      plVar12 = (long *)iDynTree::Model::getJoint((long)this);
      lVar6 = iDynTree::Traversal::getChildLinkIndexFromJointIndex
                        ((Model *)&this->m_dynamicsTraversal,(long)this);
      IVar20 = getRangeJointVariable(this,JOINT_WRENCH,idx);
      uVar9 = IVar20.size;
      lVar8 = IVar20.offset;
      lVar6 = iDynTree::LinkWrenches::operator()(linkJointWrenches,lVar6);
      local_98.super_SpatialMotionVector.super_SpatialVector<iDynTree::SpatialMotionVector>.
      linearVec3.super_Vector3.m_data[0] = *(double *)(lVar6 + 8);
      local_98.super_SpatialMotionVector.super_SpatialVector<iDynTree::SpatialMotionVector>.
      linearVec3.super_Vector3.m_data[1] = *(double *)(lVar6 + 0x10);
      local_98.super_SpatialMotionVector.super_SpatialVector<iDynTree::SpatialMotionVector>.
      linearVec3.super_Vector3.m_data[2] = *(double *)(lVar6 + 0x18);
      local_98.super_SpatialMotionVector.super_SpatialVector<iDynTree::SpatialMotionVector>.
      angularVec3.super_Vector3.m_data[0] = *(double *)(lVar6 + 0x20);
      local_98.super_SpatialMotionVector.super_SpatialVector<iDynTree::SpatialMotionVector>.
      angularVec3.super_Vector3.m_data[1] = *(double *)(lVar6 + 0x28);
      local_98.super_SpatialMotionVector.super_SpatialVector<iDynTree::SpatialMotionVector>.
      angularVec3.super_Vector3.m_data[2] = *(double *)(lVar6 + 0x30);
      lVar6 = iDynTree::VectorDynSize::data();
      iDynTree::VectorDynSize::size();
      pvVar17 = (void *)(lVar6 + lVar8 * 8);
      uVar14 = uVar9;
      if ((((ulong)pvVar17 & 7) == 0) &&
         (uVar14 = (ulong)((uint)((ulong)pvVar17 >> 3) & 1), (long)uVar9 <= (long)uVar14)) {
        uVar14 = uVar9;
      }
      if (0 < (long)uVar14) {
        memcpy(pvVar17,&local_98,uVar14 * 8);
      }
      lVar19 = uVar9 - uVar14;
      lVar10 = uVar14 + (lVar19 - (lVar19 >> 0x3f) & 0xfffffffffffffffeU);
      if (1 < lVar19) {
        lVar18 = uVar14 + 2;
        if ((long)(uVar14 + 2) < lVar10) {
          lVar18 = lVar10;
        }
        memcpy((void *)(lVar6 + (lVar8 + uVar14) * 8),
               local_98.super_SpatialMotionVector.super_SpatialVector<iDynTree::SpatialMotionVector>
               .linearVec3.super_Vector3.m_data + uVar14,
               (~uVar14 + lVar18 & 0xfffffffffffffffe) * 8 + 0x10);
      }
      if (lVar10 < (long)uVar9) {
        memcpy((void *)(lVar6 + (lVar19 / 2) * 0x10 + lVar8 * 8 + uVar14 * 8),
               local_98.super_SpatialMotionVector.super_SpatialVector<iDynTree::SpatialMotionVector>
               .linearVec3.super_Vector3.m_data + (lVar19 / 2) * 2U + uVar14,(lVar19 % 2) * 8);
      }
      iVar4 = (**(code **)(*plVar12 + 0x20))(plVar12);
      if (iVar4 != 0) {
        iVar4 = (**(code **)(*plVar12 + 0x20))(plVar12);
        if (iVar4 != 0) {
          uVar14 = 0;
          do {
            lVar6 = (**(code **)(*plVar12 + 0xc0))(plVar12);
            IVar20 = getRangeDOFVariable(this,DOF_ACCELERATION,lVar6 + uVar14);
            puVar13 = (undefined8 *)
                      iDynTree::VectorDynSize::operator()((VectorDynSize *)jointAccs,lVar6 + uVar14)
            ;
            uVar2 = *puVar13;
            puVar13 = (undefined8 *)iDynTree::VectorDynSize::operator()(d,IVar20.offset);
            *puVar13 = uVar2;
            uVar14 = uVar14 + 1;
            uVar5 = (**(code **)(*plVar12 + 0x20))(plVar12);
          } while (uVar14 < uVar5);
        }
      }
      idx = idx + 1;
      lVar6 = iDynTree::Model::getNrOfJoints();
    } while (idx < lVar6);
  }
  return true;
}

Assistant:

bool BerdyHelper::serializeDynamicVariablesFloatingBase(LinkProperAccArray& properAccs,
                                                     LinkNetTotalWrenchesWithoutGravity& /*netTotalWrenchesWithoutGrav*/,
                                                     LinkNetExternalWrenches& netExtWrenches,
                                                     LinkInternalWrenches& linkJointWrenches,
                                                     JointDOFsDoubleArray&,
                                                     JointDOFsDoubleArray& jointAccs,
                                                     VectorDynSize& d)
{
    d.resize(this->getNrOfDynamicVariables());
    assert(this->m_options.berdyVariant == BERDY_FLOATING_BASE);

    for (LinkIndex link = 0; link < static_cast<LinkIndex>(m_model.getNrOfLinks()); ++link)
    {
        // Handle acceleration
        // Convert left trivialized proper acceleration to sensor proper acceleration
        ClassicalAcc sensorProperAcc;

        sensorProperAcc.fromSpatial(properAccs(link), m_linkVels(link));
        setSubVector(d, getRangeLinkVariable(LINK_BODY_PROPER_CLASSICAL_ACCELERATION, link), toEigen(sensorProperAcc));

        // Handle external force
        setSubVector(d, getRangeLinkVariable(NET_EXT_WRENCH, link), toEigen(netExtWrenches(link)));

    }

    for (JointIndex jntIdx = 0; jntIdx < static_cast<JointIndex>(m_model.getNrOfJoints()); ++jntIdx)
    {
        IJointPtr joint = m_model.getJoint(jntIdx);

        // Handle joint wrench
        // Warning: for legacy reason linkJointWrenches is addressed using the child link index of its joint
        LinkIndex childLinkIndex = m_dynamicsTraversal.getChildLinkIndexFromJointIndex(m_model, jntIdx);
        setSubVector(d, getRangeJointVariable(JOINT_WRENCH, jntIdx), toEigen(linkJointWrenches(childLinkIndex)));

        // If the joint is not fixed, we also need to serialize the acceleration of the relative dof
        if (joint->getNrOfDOFs() > 0)
        {
            for (unsigned int localDof = 0; localDof < joint->getNrOfDOFs(); localDof++)
            {
                DOFIndex dofIdx =  joint->getDOFsOffset() + localDof;
                setSubVector(d, getRangeDOFVariable(DOF_ACCELERATION, dofIdx), jointAccs(dofIdx));
            }
        }
    }


    return true;
}